

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O0

void __thiscall
helics::ConnectorFederateManager::ConnectorFederateManager
          (ConnectorFederateManager *this,Core *coreObj,Federate *ffed,LocalFederateId fid,
          bool singleThreaded)

{
  int in_ECX;
  Translator **in_RDX;
  size_t in_RSI;
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_RDI;
  bool enableLocking;
  
  (in_RDI->m_obj).dataStorage.csize = in_RSI;
  enableLocking = SUB81((ulong)&(in_RDI->m_obj).dataStorage.dataptr >> 0x38,0);
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::shared_guarded_opt
            ((shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
              *)in_RDI,enableLocking);
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::shared_guarded_opt(in_RDI,enableLocking);
  in_RDI[2].m_obj.dataStorage.dataptr = in_RDX;
  in_RDI[2].m_obj.dataStorage.dataSlotsAvailable = in_ECX;
  return;
}

Assistant:

ConnectorFederateManager::ConnectorFederateManager(Core* coreObj,
                                                   Federate* ffed,
                                                   LocalFederateId fid,
                                                   bool singleThreaded):
    coreObject(coreObj), filters(!singleThreaded), translators(!singleThreaded), fed(ffed),
    fedID(fid)
{
}